

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicPlatformDebug.cpp
# Opt level: O2

String * __thiscall
Diligent::BasicPlatformDebug::FormatAssertionFailedMessage_abi_cxx11_
          (String *__return_storage_ptr__,BasicPlatformDebug *this,char *Message,char *Function,
          char *File,int Line)

{
  char **Args_7;
  allocator local_5d;
  int Line_local;
  char *Function_local;
  char *Message_local;
  String FileName;
  String local_28;
  
  Line_local = (int)File;
  FileName._M_dataplus._M_p = (pointer)&FileName.field_2;
  FileName._M_string_length = 0;
  FileName.field_2._M_local_buf[0] = '\0';
  Function_local = Message;
  Message_local = (char *)this;
  std::__cxx11::string::string((string *)&local_28,Function,&local_5d);
  BasicFileSystem::GetPathComponents(&local_28,(String *)0x0,&FileName);
  Args_7 = (char **)0x477711;
  std::__cxx11::string::~string((string *)&local_28);
  FormatString<char[27],char_const*,char[10],std::__cxx11::string,char[8],int,char[3],char_const*>
            (__return_storage_ptr__,(Diligent *)"Debug assertion failed in ",
             (char (*) [27])&Function_local,(char **)"(), file ",(char (*) [10])&FileName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", line ",
             (char (*) [8])&Line_local,(int *)0x65b38b,(char (*) [3])&Message_local,Args_7);
  std::__cxx11::string::~string((string *)&FileName);
  return __return_storage_ptr__;
}

Assistant:

String BasicPlatformDebug::FormatAssertionFailedMessage(const char* Message,
                                                        const char* Function, // type of __FUNCTION__
                                                        const char* File,     // type of __FILE__
                                                        int         Line)
{
    String FileName;
    BasicFileSystem::GetPathComponents(File, nullptr, &FileName);
    return FormatString("Debug assertion failed in ", Function, "(), file ", FileName, ", line ", Line, ":\n", Message);
}